

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_type_enum(lysp_ctx *ctx,lysp_stmt *stmt,lysp_type_enum **enums)

{
  ly_stmt lVar1;
  LY_ERR LVar2;
  int iVar3;
  lysp_type_enum *str_p;
  size_t name_len;
  char *pcVar4;
  char *pcVar5;
  yang_arg val_type;
  ly_ctx *local_118;
  ly_ctx *local_100;
  ly_ctx *local_e8;
  ly_ctx *local_d8;
  ly_ctx *local_b8;
  long local_b0;
  ly_ctx *local_a0;
  ly_ctx *local_88;
  ly_ctx *local_80;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  lysp_stmt *child;
  uint64_t u_;
  LY_ERR ret___2;
  LY_ERR ret___1;
  char *p__;
  LY_ERR ret__;
  lysp_type_enum *enm;
  lysp_type_enum **enums_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  val_type = Y_IDENTIF_ARG;
  if (stmt->kw == LY_STMT_ENUM) {
    val_type = Y_STR_ARG;
  }
  ctx_local._4_4_ = lysp_stmt_validate_value(ctx,val_type,stmt->arg);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    if (*enums == (lysp_type_enum *)0x0) {
      _ret___2 = (undefined8 *)malloc(0x40);
      if (_ret___2 == (undefined8 *)0x0) {
        if (ctx == (lysp_ctx *)0x0) {
          local_88 = (ly_ctx *)0x0;
        }
        else {
          local_88 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(local_88,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type_enum");
        return LY_EMEM;
      }
      *_ret___2 = 1;
    }
    else {
      *(long *)&(*enums)[-1].flags = *(long *)&(*enums)[-1].flags + 1;
      _ret___2 = (undefined8 *)realloc(&(*enums)[-1].flags,*(long *)&(*enums)[-1].flags * 0x38 + 8);
      if (_ret___2 == (undefined8 *)0x0) {
        *(long *)&(*enums)[-1].flags = *(long *)&(*enums)[-1].flags + -1;
        if (ctx == (lysp_ctx *)0x0) {
          local_80 = (ly_ctx *)0x0;
        }
        else {
          local_80 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(local_80,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type_enum");
        return LY_EMEM;
      }
    }
    *enums = (lysp_type_enum *)(_ret___2 + 1);
    str_p = *enums + *(long *)&(*enums)[-1].flags + -1;
    memset(str_p,0,0x38);
    if (stmt->kw == LY_STMT_ENUM) {
      pcVar5 = stmt->arg;
      name_len = strlen(stmt->arg);
      LVar2 = lysp_check_enum_name(ctx,pcVar5,name_len);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
    if (ctx == (lysp_ctx *)0x0) {
      local_a0 = (ly_ctx *)0x0;
    }
    else {
      local_a0 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ctx_local._4_4_ = lydict_insert(local_a0,stmt->arg,0,&str_p->name);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      if (*enums == (lysp_type_enum *)0x0) {
LAB_001b12fc:
        for (_ret___4 = stmt->child; _ret___4 != (lysp_stmt *)0x0; _ret___4 = _ret___4->next) {
          lVar1 = _ret___4->kw;
          if (lVar1 == LY_STMT_DESCRIPTION) {
            LVar2 = lysp_stmt_text_field(ctx,_ret___4,0,&str_p->dsc,Y_STR_ARG,&str_p->exts);
          }
          else if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
            LVar2 = lysp_stmt_ext(ctx,_ret___4,stmt->kw,0,&str_p->exts);
          }
          else if (lVar1 == LY_STMT_IF_FEATURE) {
            if (*(byte *)&(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1][2].schema
                < 2) {
              if (ctx == (lysp_ctx *)0x0) {
                local_d8 = (ly_ctx *)0x0;
              }
              else {
                local_d8 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar5 = lyplg_ext_stmt2str(stmt->kw);
              ly_vlog(local_d8,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                      ,"if-feature",pcVar5);
              return LY_EVALID;
            }
            LVar2 = lysp_stmt_qnames(ctx,_ret___4,&str_p->iffeatures,Y_STR_ARG,&str_p->exts);
          }
          else if (lVar1 == LY_STMT_POSITION) {
            if (stmt->kw == LY_STMT_ENUM) {
              if (ctx == (lysp_ctx *)0x0) {
                local_100 = (ly_ctx *)0x0;
              }
              else {
                local_100 = (ly_ctx *)
                            **(undefined8 **)
                              (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar5 = lyplg_ext_stmt2str(_ret___4->kw);
              pcVar4 = lyplg_ext_stmt2str(stmt->kw);
              ly_vlog(local_100,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar5,pcVar4);
              return LY_EVALID;
            }
            LVar2 = lysp_stmt_type_enum_value_pos
                              (ctx,_ret___4,&str_p->value,&str_p->flags,&str_p->exts);
          }
          else if (lVar1 == LY_STMT_REFERENCE) {
            LVar2 = lysp_stmt_text_field(ctx,_ret___4,0,&str_p->ref,Y_STR_ARG,&str_p->exts);
          }
          else if (lVar1 == LY_STMT_STATUS) {
            LVar2 = lysp_stmt_status(ctx,_ret___4,&str_p->flags,&str_p->exts);
          }
          else {
            if (lVar1 != LY_STMT_VALUE) {
              if (ctx == (lysp_ctx *)0x0) {
                local_118 = (ly_ctx *)0x0;
              }
              else {
                local_118 = (ly_ctx *)
                            **(undefined8 **)
                              (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar5 = lyplg_ext_stmt2str(_ret___4->kw);
              pcVar4 = lyplg_ext_stmt2str(stmt->kw);
              ly_vlog(local_118,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar5,pcVar4);
              return LY_EVALID;
            }
            if (stmt->kw == LY_STMT_BIT) {
              if (ctx == (lysp_ctx *)0x0) {
                local_e8 = (ly_ctx *)0x0;
              }
              else {
                local_e8 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar5 = lyplg_ext_stmt2str(_ret___4->kw);
              pcVar4 = lyplg_ext_stmt2str(stmt->kw);
              ly_vlog(local_e8,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar5,pcVar4);
              return LY_EVALID;
            }
            LVar2 = lysp_stmt_type_enum_value_pos
                              (ctx,_ret___4,&str_p->value,&str_p->flags,&str_p->exts);
          }
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
        }
        ctx_local._4_4_ = LY_SUCCESS;
      }
      else {
        child = (lysp_stmt *)0x0;
        while( true ) {
          if (*enums == (lysp_type_enum *)0x0) {
            local_b0 = 0;
          }
          else {
            local_b0 = *(long *)&(*enums)[-1].flags;
          }
          if ((lysp_stmt *)(local_b0 - 1U) <= child) goto LAB_001b12fc;
          iVar3 = strcmp((*enums)[(long)child].name,str_p->name);
          if (iVar3 == 0) break;
          child = (lysp_stmt *)((long)&child->stmt + 1);
        }
        if (ctx == (lysp_ctx *)0x0) {
          local_b8 = (ly_ctx *)0x0;
        }
        else {
          local_b8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar5 = str_p->name;
        pcVar4 = lyplg_ext_stmt2str(stmt->kw);
        ly_vlog(local_b8,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate identifier \"%s\" of %s statement."
                ,pcVar5,pcVar4);
        ctx_local._4_4_ = LY_EVALID;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_type_enum(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_type_enum **enums)
{
    struct lysp_type_enum *enm;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, stmt->kw == LY_STMT_ENUM ? Y_STR_ARG : Y_IDENTIF_ARG, stmt->arg));

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *enums, enm, LY_EMEM);

    if (stmt->kw == LY_STMT_ENUM) {
        LY_CHECK_RET(lysp_check_enum_name(ctx, stmt->arg, strlen(stmt->arg)));
    } /* else nothing specific for YANG_BIT */

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &enm->name));
    CHECK_UNIQUENESS(ctx, *enums, name, lyplg_ext_stmt2str(stmt->kw), enm->name);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &enm->dsc, Y_STR_ARG, &enm->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", lyplg_ext_stmt2str(stmt->kw));
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &enm->iffeatures, Y_STR_ARG, &enm->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &enm->ref, Y_STR_ARG, &enm->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &enm->flags, &enm->exts));
            break;
        case LY_STMT_VALUE:
            LY_CHECK_ERR_RET(stmt->kw == LY_STMT_BIT, LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw),
                    lyplg_ext_stmt2str(stmt->kw)), LY_EVALID);
            LY_CHECK_RET(lysp_stmt_type_enum_value_pos(ctx, child, &enm->value, &enm->flags, &enm->exts));
            break;
        case LY_STMT_POSITION:
            LY_CHECK_ERR_RET(stmt->kw == LY_STMT_ENUM, LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw),
                    lyplg_ext_stmt2str(stmt->kw)), LY_EVALID);
            LY_CHECK_RET(lysp_stmt_type_enum_value_pos(ctx, child, &enm->value, &enm->flags, &enm->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &enm->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(stmt->kw));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}